

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void BrotliEncoderDestroyInstance(BrotliEncoderState *state)

{
  brotli_free_func p_Var1;
  void *pvVar2;
  void *opaque;
  brotli_free_func free_func;
  MemoryManager *m;
  BrotliEncoderState *state_local;
  
  if (state != (BrotliEncoderState *)0x0) {
    p_Var1 = (state->memory_manager_).free_func;
    pvVar2 = (state->memory_manager_).opaque;
    BrotliEncoderCleanupState(state);
    (*p_Var1)(pvVar2,state);
  }
  return;
}

Assistant:

void BrotliEncoderDestroyInstance(BrotliEncoderState* state) {
  if (!state) {
    return;
  } else {
    MemoryManager* m = &state->memory_manager_;
    brotli_free_func free_func = m->free_func;
    void* opaque = m->opaque;
    BrotliEncoderCleanupState(state);
    free_func(opaque, state);
  }
}